

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O0

Float __thiscall pbrt::PMJ02BNSampler::Get1D(PMJ02BNSampler *this)

{
  ulong uVar1;
  BasicOptions *pBVar2;
  float *pfVar3;
  int *in_RDI;
  Float u;
  Float cpOffset;
  int index;
  uint64_t hash;
  int in_stack_ffffffffffffffcc;
  float local_1c;
  float local_18;
  int local_14;
  uint64_t local_10;
  
  uVar1 = (long)*in_RDI << 0x30 ^ (long)in_RDI[1] << 0x20 ^ (long)in_RDI[3] << 0x10;
  pBVar2 = GetOptions();
  local_10 = MixBits(uVar1 ^ (long)pBVar2->seed);
  local_14 = PermutationElement(in_RDI[2],in_RDI[4],(uint32_t)local_10);
  local_18 = BlueNoise((int)(uVar1 >> 0x20),(int)uVar1,in_stack_ffffffffffffffcc);
  local_1c = ((float)local_14 + local_18) / (float)in_RDI[4];
  if (1.0 <= local_1c) {
    local_1c = local_1c - 1.0;
  }
  in_RDI[3] = in_RDI[3] + 1;
  pfVar3 = std::min<float>(&local_1c,(float *)&pbrt::OneMinusEpsilon);
  return *pfVar3;
}

Assistant:

PBRT_CPU_GPU
    Float Get1D() {
        uint64_t hash = MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                                ((uint64_t)dimension << 16) ^ GetOptions().seed);

        int index = PermutationElement(sampleIndex, samplesPerPixel, hash);
        Float cpOffset = BlueNoise(dimension, pixel.x, pixel.y);
        Float u = (index + cpOffset) / samplesPerPixel;
        if (u >= 1)
            u -= 1;
        ++dimension;
        return std::min(u, OneMinusEpsilon);
    }